

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  int gtid;
  kmp_info_t *in_RSI;
  bufsize *in_RDI;
  bufsize b;
  bufsize a;
  kmp_info_t *th;
  undefined8 local_28;
  undefined8 local_20;
  
  gtid = __kmp_get_global_thread_id();
  __kmp_thread_from_gtid(gtid);
  __kmp_bget_dequeue(in_RSI);
  bcheck((kmp_info_t *)b,in_RDI,(bufsize *)in_RSI->th_pad);
  *in_RDI = local_20;
  in_RSI->th_align = local_28;
  return;
}

Assistant:

void kmpc_get_poolstat(size_t *maxmem, size_t *allmem) {
  kmp_info_t *th = __kmp_get_thread();
  bufsize a, b;

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bcheck(th, &a, &b);

  *maxmem = a;
  *allmem = b;
}